

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeIdxRowid(sqlite3 *db,BtCursor *pCur,i64 *rowid)

{
  u32 uVar1;
  uchar *p;
  BtCursor *in_RDX;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  u32 lenRowid;
  int rc;
  i64 nCellKey;
  Mem v;
  Mem m;
  u32 typeRowid;
  u32 szHdr;
  uint uVar2;
  undefined4 uVar3;
  int local_84;
  undefined8 local_80 [7];
  Mem local_48;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xaaaaaaaa;
  local_c = 0xaaaaaaaa;
  local_10 = 0xaaaaaaaa;
  uVar2 = 0xaaaaaaaa;
  memcpy(&local_48,&DAT_002ab020,0x38);
  memcpy(local_80,&DAT_002ab058,0x38);
  uVar1 = sqlite3BtreePayloadSize((BtCursor *)0x1896ec);
  p = (uchar *)(ulong)uVar1;
  sqlite3VdbeMemInit(&local_48,in_RDI,0);
  local_84 = sqlite3VdbeMemFromBtreeZeroOffset
                       (in_RDX,(u32)((ulong)p >> 0x20),(Mem *)CONCAT44(uVar3,uVar2));
  if (local_84 == 0) {
    local_c = (uint)(byte)*local_48.z;
    if (0x7f < local_c) {
      sqlite3GetVarint32(p,(u32 *)(ulong)uVar2);
    }
    if ((2 < local_c) && (local_c <= (uint)local_48.n)) {
      local_10 = (uint)(byte)local_48.z[local_c - 1];
      if (0x7f < local_10) {
        sqlite3GetVarint32(p,(u32 *)CONCAT44(local_84,uVar2));
      }
      if ((((local_10 != 0) && (local_10 < 10)) && (local_10 != 7)) &&
         (local_c + ""[local_10] <= (uint)local_48.n)) {
        sqlite3VdbeSerialGet
                  (&in_RDX->eState,(u32)((ulong)p >> 0x20),
                   (Mem *)CONCAT44(local_84,(uint)""[local_10]));
        in_RDX->eState = (undefined1)local_80[0];
        in_RDX->curFlags = local_80[0]._1_1_;
        in_RDX->curPagerFlags = local_80[0]._2_1_;
        in_RDX->hints = local_80[0]._3_1_;
        in_RDX->skipNext = local_80[0]._4_4_;
        sqlite3VdbeMemReleaseMalloc((Mem *)0x189856);
        local_84 = 0;
        goto LAB_00189878;
      }
    }
    sqlite3VdbeMemReleaseMalloc((Mem *)0x18986a);
    local_84 = sqlite3CorruptError(0);
  }
LAB_00189878:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_84;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeIdxRowid(sqlite3 *db, BtCursor *pCur, i64 *rowid){
  i64 nCellKey = 0;
  int rc;
  u32 szHdr;        /* Size of the header */
  u32 typeRowid;    /* Serial type of the rowid */
  u32 lenRowid;     /* Size of the rowid */
  Mem m, v;

  /* Get the size of the index entry.  Only indices entries of less
  ** than 2GiB are support - anything large must be database corruption.
  ** Any corruption is detected in sqlite3BtreeParseCellPtr(), though, so
  ** this code can safely assume that nCellKey is 32-bits
  */
  assert( sqlite3BtreeCursorIsValid(pCur) );
  nCellKey = sqlite3BtreePayloadSize(pCur);
  assert( (nCellKey & SQLITE_MAX_U32)==(u64)nCellKey );

  /* Read in the complete content of the index entry */
  sqlite3VdbeMemInit(&m, db, 0);
  rc = sqlite3VdbeMemFromBtreeZeroOffset(pCur, (u32)nCellKey, &m);
  if( rc ){
    return rc;
  }

  /* The index entry must begin with a header size */
  getVarint32NR((u8*)m.z, szHdr);
  testcase( szHdr==3 );
  testcase( szHdr==(u32)m.n );
  testcase( szHdr>0x7fffffff );
  assert( m.n>=0 );
  if( unlikely(szHdr<3 || szHdr>(unsigned)m.n) ){
    goto idx_rowid_corruption;
  }

  /* The last field of the index should be an integer - the ROWID.
  ** Verify that the last entry really is an integer. */
  getVarint32NR((u8*)&m.z[szHdr-1], typeRowid);
  testcase( typeRowid==1 );
  testcase( typeRowid==2 );
  testcase( typeRowid==3 );
  testcase( typeRowid==4 );
  testcase( typeRowid==5 );
  testcase( typeRowid==6 );
  testcase( typeRowid==8 );
  testcase( typeRowid==9 );
  if( unlikely(typeRowid<1 || typeRowid>9 || typeRowid==7) ){
    goto idx_rowid_corruption;
  }
  lenRowid = sqlite3SmallTypeSizes[typeRowid];
  testcase( (u32)m.n==szHdr+lenRowid );
  if( unlikely((u32)m.n<szHdr+lenRowid) ){
    goto idx_rowid_corruption;
  }

  /* Fetch the integer off the end of the index record */
  sqlite3VdbeSerialGet((u8*)&m.z[m.n-lenRowid], typeRowid, &v);
  *rowid = v.u.i;
  sqlite3VdbeMemReleaseMalloc(&m);
  return SQLITE_OK;

  /* Jump here if database corruption is detected after m has been
  ** allocated.  Free the m object and return SQLITE_CORRUPT. */
idx_rowid_corruption:
  testcase( m.szMalloc!=0 );
  sqlite3VdbeMemReleaseMalloc(&m);
  return SQLITE_CORRUPT_BKPT;
}